

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_ManExtractGroupInt
               (Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vFonIns,Vec_Int_t *vFonOuts
               )

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  Cba_NtkCleanObjCopies(p);
  Cba_NtkCleanFonCopies(p);
  for (iVar6 = 0; iVar6 < vFonIns->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vFonIns,iVar6);
    iVar2 = Cba_ObjAlloc(pNew,CBA_OBJ_PI,0,1);
    iVar3 = Cba_ObjFon0(pNew,iVar2);
    Cba_FonSetCopy(p,iVar1,iVar3);
    if (0 < (p->vObjName).nSize) {
      iVar3 = Cba_FonObj(p,iVar1);
      iVar3 = Cba_ObjName(p,iVar3);
      Cba_ObjSetName(pNew,iVar2,iVar3);
    }
    if (0 < (p->vFonName).nSize) {
      iVar2 = Cba_ObjFon0(pNew,iVar2);
      iVar1 = Cba_FonName(p,iVar1);
      Cba_FonSetName(pNew,iVar2,iVar1);
    }
  }
  iVar6 = 0;
  while( true ) {
    iVar1 = vObjs->nSize;
    if (iVar1 <= iVar6) break;
    iVar1 = Vec_IntEntry(vObjs,iVar6);
    iVar2 = Cba_ObjDup(pNew,p,iVar1);
    if (0 < (p->vObjName).nSize) {
      iVar3 = Cba_ObjName(p,iVar1);
      Cba_ObjSetName(pNew,iVar2,iVar3);
    }
    iVar3 = Cba_ObjFon0(p,iVar1);
    iVar7 = 0;
    while( true ) {
      iVar5 = iVar3 + iVar7;
      iVar4 = Cba_ObjFon0(p,iVar1 + 1);
      if (iVar4 <= iVar5) break;
      iVar4 = Cba_ObjFon(pNew,iVar2,iVar7);
      Cba_FonSetCopy(p,iVar5,iVar4);
      if (0 < (p->vFonName).nSize) {
        iVar4 = Cba_ObjFon(pNew,iVar2,iVar7);
        iVar5 = Cba_FonName(p,iVar5);
        Cba_FonSetName(pNew,iVar4,iVar5);
      }
      iVar7 = iVar7 + 1;
    }
    iVar6 = iVar6 + 1;
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar6);
    iVar2 = Cba_ObjCopy(p,iVar1);
    iVar3 = Cba_ObjFin0(p,iVar1);
    iVar7 = 0;
    while( true ) {
      iVar4 = Cba_ObjFin0(p,iVar1 + 1);
      if (iVar4 <= iVar3 + iVar7) break;
      iVar4 = Cba_FinFon(p,iVar3 + iVar7);
      iVar4 = Cba_FonCopy(p,iVar4);
      Cba_ObjSetFinFon(pNew,iVar2,iVar7,iVar4);
      iVar7 = iVar7 + 1;
    }
    iVar1 = vObjs->nSize;
  }
  for (iVar6 = 0; iVar6 < vFonOuts->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vFonOuts,iVar6);
    iVar2 = Cba_ObjAlloc(pNew,CBA_OBJ_PO,1,0);
    if (0 < (p->vObjName).nSize) {
      iVar3 = Cba_FonName(p,iVar1);
      Cba_ObjSetName(pNew,iVar2,iVar3);
    }
    iVar1 = Cba_FonCopy(p,iVar1);
    Cba_ObjSetFinFon(pNew,iVar2,0,iVar1);
  }
  if ((pNew->vObjType).nSize != (pNew->vObjType).nCap) {
    __assert_fail("Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bb,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((pNew->vFinFon).nSize != (pNew->vFinFon).nCap) {
    __assert_fail("Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bc,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((pNew->vFonObj).nSize == (pNew->vFonObj).nCap) {
    return;
  }
  __assert_fail("Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                ,0x3bd,
                "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Cba_ManExtractGroupInt( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vFonIns, Vec_Int_t * vFonOuts )
{
    int i, k, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // create inputs and map fons
    Vec_IntForEachEntry( vFonIns, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PI, 0, 1 );
        Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, Cba_FonObj(p, iFon)) );
        if ( Cba_NtkHasFonNames(p) )
            Cba_FonSetName( pNew, Cba_ObjFon0(pNew, iObjNew), Cba_FonName(p, iFon) );

    }
    // create internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjDup( pNew, p, iObj );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, iObj) );
        Cba_ObjForEachFon( p, iObj, iFon, k )
        {
            Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, k) );
            if ( Cba_NtkHasFonNames(p) )
                Cba_FonSetName( pNew, Cba_ObjFon(pNew, iObjNew, k), Cba_FonName(p, iFon) );
        }
    }
    // connect internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjCopy( p, iObj );
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( pNew, iObjNew, k, Cba_FonCopy(p, iFon) );
    }
    // create POs
    Vec_IntForEachEntry( vFonOuts, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PO, 1, 0 );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_FonName(p, iFon) );
        Cba_ObjSetFinFon( pNew, iObjNew, 0, Cba_FonCopy(p, iFon) );
    }
    assert( Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew) );
    assert( Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew) );
    assert( Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew) );
}